

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5f699::CtorEvalExternalInterface::tableStore
          (CtorEvalExternalInterface *this,Name tableName,Address index,Literal *value)

{
  string *psVar1;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  if (this->instanceInitialized != true) {
    return;
  }
  psVar1 = (string *)
           __cxa_allocate_exception
                     (0x20,tableName.super_IString.str._M_len,tableName.super_IString.str._M_str);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"tableStore after init: TODO","");
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar1,local_48,local_48 + local_40);
  __cxa_throw(psVar1,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

void
  tableStore(Name tableName, Address index, const Literal& value) override {
    // We allow stores to the table during initialization, but not after, as we
    // assume the table does not change at runtime.
    // TODO: Allow table changes by updating the table later like we do with the
    //       memory, by tracking and serializing them.
    if (instanceInitialized) {
      throw FailToEvalException("tableStore after init: TODO");
    }
  }